

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O3

void prvTidyPopInline(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  ulong uVar4;
  Lexer *lexer;
  
  pLVar2 = doc->lexer;
  if (node != (Node *)0x0) {
    pDVar3 = node->tag;
    if (pDVar3 == (Dict *)0x0) {
      return;
    }
    if ((pDVar3->model & 0x810) != 0x10) {
      return;
    }
    TVar1 = pDVar3->id;
    if (TVar1 == TidyTag_INS) {
      return;
    }
    if (TVar1 == TidyTag_DEL) {
      return;
    }
    if (TVar1 == TidyTag_A) {
      uVar4 = (ulong)pLVar2->istacksize;
      do {
        if ((int)uVar4 == 0) {
          return;
        }
        PopIStack(doc);
        uVar4 = (ulong)pLVar2->istacksize;
      } while ((pLVar2->istack[uVar4].tag)->id != TidyTag_A);
      return;
    }
  }
  if ((pLVar2->istacksize != 0) &&
     (PopIStack(doc), pLVar2->istack + pLVar2->istacksize <= pLVar2->insert)) {
    pLVar2->insert = (IStack *)0x0;
  }
  return;
}

Assistant:

void TY_(PopInline)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    if (node)
    {
        if ( !IsNodePushable(node) )
            return;

        /* if node is </a> then pop until we find an <a> */
        if ( nodeIsA(node) )
        {
            PopIStackUntil( doc, TidyTag_A );
            return;
        }
    }

    if (lexer->istacksize > 0)
    {
        PopIStack( doc );

        /* #427822 - fix by Randy Waki 7 Aug 00 */
        if (lexer->insert >= lexer->istack + lexer->istacksize)
            lexer->insert = NULL;
    }
}